

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  int iVar5;
  Generator js_generator;
  ObjectiveCGenerator objc_generator;
  Generator csharp_generator;
  Generator rb_generator;
  Generator php_generator;
  JavaNanoGenerator javanano_generator;
  JavaGenerator java_generator;
  CppGenerator cpp_generator;
  Generator py_generator;
  CommandLineInterface cli;
  string local_388;
  string local_368;
  string local_348;
  CodeGenerator local_328;
  CodeGenerator local_320;
  CodeGenerator local_318;
  CodeGenerator local_310;
  CodeGenerator local_308;
  CodeGenerator local_300;
  CodeGenerator local_2f8;
  undefined1 local_2f0 [64];
  CommandLineInterface local_2b0;
  
  google::protobuf::compiler::CommandLineInterface::CommandLineInterface(&local_2b0);
  pcVar4 = local_2f0 + 0x10;
  local_2f0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"protoc-","");
  google::protobuf::compiler::CommandLineInterface::AllowPlugins(&local_2b0,(string *)local_2f0);
  if ((pointer)local_2f0._0_8_ != pcVar4) {
    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
  }
  google::protobuf::compiler::cpp::CppGenerator::CppGenerator((CppGenerator *)&local_2f8);
  local_2f0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"--cpp_out","");
  paVar1 = &local_368.field_2;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--cpp_opt","");
  paVar2 = &local_388.field_2;
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"Generate C++ header and source.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,(string *)local_2f0,&local_368,&local_2f8,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2f0._0_8_ != pcVar4) {
    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
  }
  google::protobuf::compiler::java::JavaGenerator::JavaGenerator((JavaGenerator *)&local_300);
  local_2f0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"--java_out","");
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--java_opt","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"Generate Java source file.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,(string *)local_2f0,&local_368,&local_300,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2f0._0_8_ != pcVar4) {
    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
  }
  google::protobuf::compiler::python::Generator::Generator((Generator *)local_2f0);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--python_out","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"Generate Python source file.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,&local_368,(CodeGenerator *)local_2f0,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  google::protobuf::compiler::javanano::JavaNanoGenerator::JavaNanoGenerator
            ((JavaNanoGenerator *)&local_308);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--javanano_out","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"Generate Java Nano source file.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,&local_368,&local_308,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_310._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_0041fd90;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--php_out","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"Generate PHP source file.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,&local_368,&local_310,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_318._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_00420318;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--ruby_out","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"Generate Ruby source file.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,&local_368,&local_318,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_320._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_0041eec8;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--csharp_out","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--csharp_opt","");
  paVar3 = &local_348.field_2;
  local_348._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,"Generate C# source file.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,&local_368,&local_388,&local_320,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar3) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  google::protobuf::compiler::objectivec::ObjectiveCGenerator::ObjectiveCGenerator
            ((ObjectiveCGenerator *)&local_328);
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--objc_out","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--objc_opt","");
  local_348._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,"Generate Objective C header and source.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,&local_368,&local_388,&local_328,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar3) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_348._M_dataplus._M_p = (pointer)&PTR__CodeGenerator_0041f750;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--js_out","");
  local_388._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"Generate JavaScript source.","");
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2b0,&local_368,(CodeGenerator *)&local_348,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  iVar5 = google::protobuf::compiler::CommandLineInterface::Run(&local_2b0,argc,argv);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator((CodeGenerator *)&local_348);
  google::protobuf::compiler::objectivec::ObjectiveCGenerator::~ObjectiveCGenerator
            ((ObjectiveCGenerator *)&local_328);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator(&local_320);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator(&local_318);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator(&local_310);
  google::protobuf::compiler::javanano::JavaNanoGenerator::~JavaNanoGenerator
            ((JavaNanoGenerator *)&local_308);
  google::protobuf::compiler::python::Generator::~Generator((Generator *)local_2f0);
  google::protobuf::compiler::java::JavaGenerator::~JavaGenerator((JavaGenerator *)&local_300);
  google::protobuf::compiler::cpp::CppGenerator::~CppGenerator((CppGenerator *)&local_2f8);
  google::protobuf::compiler::CommandLineInterface::~CommandLineInterface(&local_2b0);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {

  google::protobuf::compiler::CommandLineInterface cli;
  cli.AllowPlugins("protoc-");

  // Proto2 C++
  google::protobuf::compiler::cpp::CppGenerator cpp_generator;
  cli.RegisterGenerator("--cpp_out", "--cpp_opt", &cpp_generator,
                        "Generate C++ header and source.");

#ifndef OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP
  // Proto2 Java
  google::protobuf::compiler::java::JavaGenerator java_generator;
  cli.RegisterGenerator("--java_out", "--java_opt", &java_generator,
                        "Generate Java source file.");
#endif  // !OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP


#ifndef OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP
  // Proto2 Python
  google::protobuf::compiler::python::Generator py_generator;
  cli.RegisterGenerator("--python_out", &py_generator,
                        "Generate Python source file.");

  // Java Nano
  google::protobuf::compiler::javanano::JavaNanoGenerator javanano_generator;
  cli.RegisterGenerator("--javanano_out", &javanano_generator,
                        "Generate Java Nano source file.");

  // PHP
  google::protobuf::compiler::php::Generator php_generator;
  cli.RegisterGenerator("--php_out", &php_generator,
                        "Generate PHP source file.");

  // Ruby
  google::protobuf::compiler::ruby::Generator rb_generator;
  cli.RegisterGenerator("--ruby_out", &rb_generator,
                        "Generate Ruby source file.");

  // CSharp
  google::protobuf::compiler::csharp::Generator csharp_generator;
  cli.RegisterGenerator("--csharp_out", "--csharp_opt", &csharp_generator,
                        "Generate C# source file.");

  // Objective C
  google::protobuf::compiler::objectivec::ObjectiveCGenerator objc_generator;
  cli.RegisterGenerator("--objc_out", "--objc_opt", &objc_generator,
                        "Generate Objective C header and source.");

  // JavaScript
  google::protobuf::compiler::js::Generator js_generator;
  cli.RegisterGenerator("--js_out", &js_generator,
                        "Generate JavaScript source.");
#endif  // !OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP

  return cli.Run(argc, argv);
}